

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interval.cpp
# Opt level: O0

Interval interval::neg(Interval i)

{
  int iVar1;
  int *piVar2;
  int local_d8;
  Interval local_d4;
  int local_cc;
  Interval local_c8;
  int local_c0;
  Interval local_bc;
  int local_b4;
  Interval local_b0;
  Interval local_a8;
  Interval local_a0;
  Interval local_98;
  Interval local_90;
  Interval local_88;
  Interval local_80;
  Interval local_78;
  Interval local_70;
  Interval local_68;
  Interval local_60;
  Interval local_58;
  Interval local_50;
  Interval local_48;
  Interval local_40;
  Interval local_38;
  Interval local_30;
  Interval local_28;
  Interval local_20;
  Interval local_18;
  Interval i_local;
  Interval result;
  
  local_18 = i;
  std::pair<int,_int>::pair<int,_int,_true>(&i_local);
  local_20 = local_18;
  iVar1 = lower(local_18);
  if (iVar1 == -0x80000000) {
    local_28 = local_18;
    iVar1 = upper(local_18);
    if (iVar1 == 0x7fffffff) {
      local_30 = full();
      std::pair<int,_int>::operator=(&i_local,&local_30);
      return i_local;
    }
  }
  local_38 = local_18;
  iVar1 = lower(local_18);
  if (iVar1 == 0x7fffffff) {
    local_40 = local_18;
    iVar1 = upper(local_18);
    if (iVar1 == -0x80000000) {
      local_48 = empty();
      std::pair<int,_int>::operator=(&i_local,&local_48);
      return i_local;
    }
  }
  local_50 = local_18;
  iVar1 = lower(local_18);
  if (iVar1 == -0x80000000) {
    local_58 = local_18;
    iVar1 = upper(local_18);
    if (iVar1 == -0x80000000) {
      local_60 = make(0x7fffffff,0x7fffffff);
      std::pair<int,_int>::operator=(&i_local,&local_60);
      return i_local;
    }
  }
  local_68 = local_18;
  iVar1 = lower(local_18);
  if (iVar1 == 0x7fffffff) {
    local_70 = local_18;
    iVar1 = upper(local_18);
    if (iVar1 == 0x7fffffff) {
      local_78 = make(-0x80000000,-0x80000000);
      std::pair<int,_int>::operator=(&i_local,&local_78);
      return i_local;
    }
  }
  local_80 = local_18;
  iVar1 = upper(local_18);
  if (iVar1 == 0x7fffffff) {
    local_90 = local_18;
    iVar1 = lower(local_18);
    local_88 = make(-0x80000000,-iVar1);
    std::pair<int,_int>::operator=(&i_local,&local_88);
  }
  else {
    local_98 = local_18;
    iVar1 = lower(local_18);
    if (iVar1 == -0x80000000) {
      local_a8 = local_18;
      iVar1 = upper(local_18);
      local_a0 = make(-iVar1,0x7fffffff);
      std::pair<int,_int>::operator=(&i_local,&local_a0);
    }
    else {
      local_bc = local_18;
      local_b4 = upper(local_18);
      local_b4 = -local_b4;
      local_c8 = local_18;
      local_c0 = lower(local_18);
      local_c0 = -local_c0;
      piVar2 = std::min<int>(&local_b4,&local_c0);
      iVar1 = *piVar2;
      local_d4 = local_18;
      local_cc = upper(local_18);
      local_cc = -local_cc;
      local_d8 = lower(local_18);
      local_d8 = -local_d8;
      piVar2 = std::max<int>(&local_cc,&local_d8);
      local_b0 = make(iVar1,*piVar2);
      std::pair<int,_int>::operator=(&i_local,&local_b0);
    }
  }
  return i_local;
}

Assistant:

Interval interval::neg(Interval i) {
  Interval result;
  if (minf == lower(i) && pinf == upper(i)) {
    result = full();
  } else if (pinf == lower(i) && minf == upper(i)) {
    result = empty();
  } else if (minf == lower(i) && minf == upper(i)) {
    result = make(pinf, pinf);
  } else if (pinf == lower(i) && pinf == upper(i)) {
    result = make(minf, minf);
  } else if (pinf == upper(i)) {
    result = make(minf, -(lower(i)));
  } else if (minf == lower(i)) {
    result = make(-(upper(i)), pinf);
  } else {
    result = make(std::min(-(upper(i)),-(lower(i))), 
                  std::max(-(upper(i)),-(lower(i))));
  }
  return result;
}